

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

uintm __thiscall PatternBlock::getMask(PatternBlock *this,int4 startbit,int4 size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint local_2c;
  value_type local_28;
  uintm tmp;
  uintm res;
  int4 wordnum2;
  int4 shift;
  int4 wordnum1;
  int4 size_local;
  int4 startbit_local;
  PatternBlock *this_local;
  
  iVar1 = startbit + this->offset * -8;
  iVar2 = (int)((ulong)(long)iVar1 >> 5);
  iVar3 = (int)((ulong)(long)(iVar1 + size + -1) >> 5);
  if (iVar2 < 0) {
LAB_0070e856:
    local_28 = 0;
  }
  else {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->maskvec);
    if (sVar4 <= (ulong)(long)iVar2) goto LAB_0070e856;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->maskvec,(long)iVar2);
    local_28 = *pvVar5;
  }
  local_28 = local_28 << ((byte)iVar1 & 0x1f);
  if (iVar2 == iVar3) goto LAB_0070e8e5;
  if (iVar3 < 0) {
LAB_0070e8af:
    local_2c = 0;
  }
  else {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->maskvec);
    if (sVar4 <= (ulong)(long)iVar3) goto LAB_0070e8af;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->maskvec,(long)iVar3);
    local_2c = *pvVar5;
  }
  local_28 = local_2c >> (0x20 - ((byte)iVar1 & 0x1f) & 0x1f) | local_28;
LAB_0070e8e5:
  return local_28 >> (0x20U - (char)size & 0x1f);
}

Assistant:

uintm PatternBlock::getMask(int4 startbit,int4 size) const

{
  startbit -= 8*offset;
  // Note the division and remainder here is unsigned.  Then it is recast to signed. 
  // If startbit is negative, then wordnum1 is either negative or very big,
  // if (unsigned size is same as sizeof int)
  // In either case, shift should come out between 0 and 8*sizeof(uintm)-1
  int4 wordnum1 = startbit/(8*sizeof(uintm));
  int4 shift = startbit % (8*sizeof(uintm));
  int4 wordnum2 = (startbit+size-1)/(8*sizeof(uintm));
  uintm res;

  if ((wordnum1<0)||(wordnum1>=maskvec.size()))
    res = 0;
  else
    res = maskvec[wordnum1];

  res <<= shift;
  if (wordnum1 != wordnum2) {
    uintm tmp;
    if ((wordnum2<0)||(wordnum2>=maskvec.size()))
      tmp = 0;
    else
      tmp = maskvec[wordnum2];
    res |= (tmp>>(8*sizeof(uintm)-shift));
  }
  res >>= (8*sizeof(uintm) - size);
  
  return res;
}